

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_pubnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_pubnonce *nonce,uchar *in66)

{
  int iVar1;
  secp256k1_ge *elem;
  long lVar2;
  secp256k1_ge *a;
  secp256k1_ge ges [2];
  secp256k1_ge asStack_d8 [2];
  
  elem = asStack_d8;
  a = asStack_d8;
  if ((nonce == (secp256k1_musig_pubnonce *)0x0) || (in66 == (uchar *)0x0)) {
    secp256k1_musig_pubnonce_parse_cold_1();
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    do {
      iVar1 = secp256k1_eckey_pubkey_parse(elem,in66 + lVar2,0x21);
      if (iVar1 == 0) {
        return 0;
      }
      lVar2 = lVar2 + 0x21;
      elem = elem + 1;
    } while (lVar2 == 0x21);
    nonce->data[0] = 0xf5;
    nonce->data[1] = 'z';
    nonce->data[2] = '=';
    nonce->data[3] = 0xa0;
    lVar2 = 0;
    do {
      secp256k1_ge_to_bytes(nonce->data + lVar2 + 4,a);
      lVar2 = lVar2 + 0x40;
      a = a + 1;
    } while (lVar2 == 0x40);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int secp256k1_musig_pubnonce_parse(const secp256k1_context* ctx, secp256k1_musig_pubnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_eckey_pubkey_parse(&ges[i], &in66[33*i], 33)) {
            return 0;
        }
        if (!secp256k1_ge_is_in_correct_subgroup(&ges[i])) {
            return 0;
        }
    }
    secp256k1_musig_pubnonce_save(nonce, ges);
    return 1;
}